

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monotone.c
# Opt level: O3

monotoneVectorsStruct * allocPointersToMonotoneVectors(void)

{
  monotoneVectorsStruct *pmVar1;
  
  pmVar1 = (monotoneVectorsStruct *)calloc(1,0x18);
  return pmVar1;
}

Assistant:

struct monotoneVectorsStruct *allocPointersToMonotoneVectors()
{
	struct monotoneVectorsStruct *newPointersToMonotoneVectors;

	newPointersToMonotoneVectors = (struct monotoneVectorsStruct *)malloc(sizeof (struct monotoneVectorsStruct));

	newPointersToMonotoneVectors->attrKnownMonotone = NULL;
	newPointersToMonotoneVectors->attrCandMonotone = NULL;
	newPointersToMonotoneVectors->attrHintMonotone = NULL;
		
	assert( newPointersToMonotoneVectors != NULL );
	return newPointersToMonotoneVectors;
}